

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O0

bool __thiscall spvtools::opt::LoopFusion::AreCompatible(LoopFusion *this)

{
  pointer *this_00;
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  BasicBlock *pBVar4;
  Function *pFVar5;
  Function *pFVar6;
  CFG *pCVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar8;
  size_type sVar9;
  reference ppIVar10;
  BasicBlock *pBVar11;
  reference pvVar12;
  reference pvVar13;
  DefUseManager *pDVar14;
  anon_class_8_1_ff777492 local_118;
  function<void_(spvtools::opt::Instruction_*,_unsigned_int)> local_110;
  bool local_e9;
  Instruction *pIStack_e8;
  bool is_used;
  Instruction *variable;
  Instruction *inst;
  iterator __end3;
  iterator __begin3;
  BasicBlock *__range3;
  BasicBlock *block_1;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *__range2;
  reference local_90;
  value_type *block;
  vector<unsigned_int,_std::allocator<unsigned_int>_> preds;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> block_to_check;
  BasicBlock *pre_header_1;
  undefined1 local_48 [8];
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> inductions_1;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> inductions_0;
  LoopFusion *this_local;
  
  pBVar4 = Loop::GetHeaderBlock(this->loop_0_);
  pFVar5 = BasicBlock::GetParent(pBVar4);
  pBVar4 = Loop::GetHeaderBlock(this->loop_1_);
  pFVar6 = BasicBlock::GetParent(pBVar4);
  if (pFVar5 != pFVar6) {
    this_local._7_1_ = 0;
    goto LAB_00475b3a;
  }
  pBVar4 = Loop::GetPreHeaderBlock(this->loop_0_);
  if ((pBVar4 == (BasicBlock *)0x0) ||
     (pBVar4 = Loop::GetPreHeaderBlock(this->loop_1_), pBVar4 == (BasicBlock *)0x0)) {
    this_local._7_1_ = 0;
    goto LAB_00475b3a;
  }
  pCVar7 = IRContext::cfg(this->context_);
  pBVar4 = Loop::GetMergeBlock(this->loop_0_);
  uVar2 = BasicBlock::id(pBVar4);
  pvVar8 = CFG::preds(pCVar7,uVar2);
  sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
  if (sVar9 == 1) {
    pCVar7 = IRContext::cfg(this->context_);
    pBVar4 = Loop::GetMergeBlock(this->loop_1_);
    uVar2 = BasicBlock::id(pBVar4);
    pvVar8 = CFG::preds(pCVar7,uVar2);
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
    if (sVar9 == 1) {
      pCVar7 = IRContext::cfg(this->context_);
      pBVar4 = Loop::GetContinueBlock(this->loop_0_);
      uVar2 = BasicBlock::id(pBVar4);
      pvVar8 = CFG::preds(pCVar7,uVar2);
      sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
      if (sVar9 == 1) {
        pCVar7 = IRContext::cfg(this->context_);
        pBVar4 = Loop::GetContinueBlock(this->loop_1_);
        uVar2 = BasicBlock::id(pBVar4);
        pvVar8 = CFG::preds(pCVar7,uVar2);
        sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
        if (sVar9 == 1) {
          memset(&inductions_1.
                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,0,0x18);
          std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
          vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)&inductions_1.
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          memset(local_48,0,0x18);
          std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
          vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)local_48);
          Loop::GetInductionVariables
                    (this->loop_0_,
                     (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)&inductions_1.
                         super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          RemoveIfNotUsedContinueOrConditionBlock
                    (this,(vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           *)&inductions_1.
                              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,this->loop_0_);
          sVar9 = std::
                  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  ::size((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          *)&inductions_1.
                             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (sVar9 == 1) {
            ppIVar10 = std::
                       vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                       ::front((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                *)&inductions_1.
                                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
            this->induction_0_ = *ppIVar10;
            Loop::GetInductionVariables
                      (this->loop_1_,
                       (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                        *)local_48);
            RemoveIfNotUsedContinueOrConditionBlock
                      (this,(vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                             *)local_48,this->loop_1_);
            sVar9 = std::
                    vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ::size((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            *)local_48);
            if (sVar9 == 1) {
              ppIVar10 = std::
                         vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                         ::front((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                  *)local_48);
              this->induction_1_ = *ppIVar10;
              bVar1 = CheckInit(this);
              if (bVar1) {
                bVar1 = CheckCondition(this);
                if (bVar1) {
                  bVar1 = CheckStep(this);
                  if (bVar1) {
                    block_to_check.
                    super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)Loop::GetPreHeaderBlock(this->loop_1_);
                    memset(&preds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,0,0x18);
                    std::
                    vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    ::vector((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                              *)&preds.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
                    std::
                    vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    ::push_back((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                                 *)&preds.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (value_type *)
                                &block_to_check.
                                 super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    pBVar4 = Loop::GetMergeBlock(this->loop_0_);
                    pBVar11 = Loop::GetPreHeaderBlock(this->loop_1_);
                    if (pBVar4 == pBVar11) {
LAB_004758bd:
                      this_00 = &preds.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage;
                      __end2 = std::
                               vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                               ::begin((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                                        *)this_00);
                      block_1 = (BasicBlock *)
                                std::
                                vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                                ::end((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                                       *)this_00);
                      while (bVar1 = __gnu_cxx::operator!=
                                               (&__end2,(
                                                  __normal_iterator<spvtools::opt::BasicBlock_**,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
                                                  *)&block_1), bVar1) {
                        __gnu_cxx::
                        __normal_iterator<spvtools::opt::BasicBlock_**,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
                        ::operator*(&__end2);
                        BasicBlock::begin((BasicBlock *)&__end3);
                        BasicBlock::end((BasicBlock *)&inst);
                        while (bVar1 = utils::operator!=(&__end3.super_iterator,
                                                         (
                                                  iterator_template<spvtools::opt::Instruction> *)
                                                  &inst), bVar1) {
                          variable = utils::IntrusiveList<spvtools::opt::Instruction>::
                                     iterator_template<spvtools::opt::Instruction>::operator*
                                               (&__end3.super_iterator);
                          OVar3 = Instruction::opcode(variable);
                          if (OVar3 == OpStore) {
                            pDVar14 = IRContext::get_def_use_mgr(this->context_);
                            uVar2 = Instruction::GetSingleWordInOperand(variable,0);
                            pIStack_e8 = analysis::DefUseManager::GetDef(pDVar14,uVar2);
                            OVar3 = Instruction::opcode(pIStack_e8);
                            if ((OVar3 != OpVariable) ||
                               (uVar2 = Instruction::GetSingleWordInOperand(pIStack_e8,0),
                               uVar2 != 7)) {
                              this_local._7_1_ = 0;
                              goto LAB_00475b1f;
                            }
                            local_e9 = false;
                            pDVar14 = IRContext::get_def_use_mgr(this->context_);
                            uVar2 = Instruction::GetSingleWordInOperand(variable,0);
                            local_118.is_used = &local_e9;
                            std::function<void(spvtools::opt::Instruction*,unsigned_int)>::
                            function<spvtools::opt::LoopFusion::AreCompatible()::__0,void>
                                      ((function<void(spvtools::opt::Instruction*,unsigned_int)> *)
                                       &local_110,&local_118);
                            analysis::DefUseManager::ForEachUse(pDVar14,uVar2,&local_110);
                            std::function<void_(spvtools::opt::Instruction_*,_unsigned_int)>::
                            ~function(&local_110);
                            if ((local_e9 & 1U) != 0) {
                              this_local._7_1_ = 0;
                              goto LAB_00475b1f;
                            }
                          }
                          else {
                            OVar3 = Instruction::opcode(variable);
                            if (OVar3 == OpPhi) {
                              uVar2 = Instruction::NumInOperands(variable);
                              if (uVar2 != 2) {
                                this_local._7_1_ = 0;
                                goto LAB_00475b1f;
                              }
                            }
                            else {
                              OVar3 = Instruction::opcode(variable);
                              if (OVar3 != OpBranch) {
                                this_local._7_1_ = 0;
                                goto LAB_00475b1f;
                              }
                            }
                          }
                          InstructionList::iterator::operator++(&__end3);
                        }
                        __gnu_cxx::
                        __normal_iterator<spvtools::opt::BasicBlock_**,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
                        ::operator++(&__end2);
                      }
                      this_local._7_1_ = 1;
                    }
                    else {
                      pCVar7 = IRContext::cfg(this->context_);
                      uVar2 = BasicBlock::id((BasicBlock *)
                                             block_to_check.
                                             super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      pvVar8 = CFG::preds(pCVar7,uVar2);
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&block,
                                 pvVar8);
                      sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                         &block);
                      if (sVar9 == 1) {
                        pFVar5 = this->containing_function_;
                        pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front
                                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                             &block);
                        ___range2 = Function::FindBlock(pFVar5,*pvVar12);
                        pvVar13 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                                            ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *
                                             )&__range2);
                        local_90 = pvVar13;
                        pBVar4 = Loop::GetMergeBlock(this->loop_0_);
                        if (pvVar13 == pBVar4) {
                          std::
                          vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                          ::push_back((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                                       *)&preds.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      &local_90);
                          bVar1 = false;
                        }
                        else {
                          this_local._7_1_ = 0;
                          bVar1 = true;
                        }
                      }
                      else {
                        this_local._7_1_ = 0;
                        bVar1 = true;
                      }
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&block);
                      if (!bVar1) goto LAB_004758bd;
                    }
LAB_00475b1f:
                    std::
                    vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    ::~vector((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                               *)&preds.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
                  }
                  else {
                    this_local._7_1_ = 0;
                  }
                }
                else {
                  this_local._7_1_ = 0;
                }
              }
              else {
                this_local._7_1_ = 0;
              }
            }
            else {
              this_local._7_1_ = 0;
            }
          }
          else {
            this_local._7_1_ = 0;
          }
          std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
          ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)local_48);
          std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
          ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)&inductions_1.
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          goto LAB_00475b3a;
        }
      }
      this_local._7_1_ = 0;
      goto LAB_00475b3a;
    }
  }
  this_local._7_1_ = 0;
LAB_00475b3a:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool LoopFusion::AreCompatible() {
  // Check that the loops are in the same function.
  if (loop_0_->GetHeaderBlock()->GetParent() !=
      loop_1_->GetHeaderBlock()->GetParent()) {
    return false;
  }

  // Check that both loops have pre-header blocks.
  if (!loop_0_->GetPreHeaderBlock() || !loop_1_->GetPreHeaderBlock()) {
    return false;
  }

  // Check there are no breaks.
  if (context_->cfg()->preds(loop_0_->GetMergeBlock()->id()).size() != 1 ||
      context_->cfg()->preds(loop_1_->GetMergeBlock()->id()).size() != 1) {
    return false;
  }

  // Check there are no continues.
  if (context_->cfg()->preds(loop_0_->GetContinueBlock()->id()).size() != 1 ||
      context_->cfg()->preds(loop_1_->GetContinueBlock()->id()).size() != 1) {
    return false;
  }

  // |GetInductionVariables| returns all OpPhi in the header. Check that both
  // loops have exactly one that is used in the continue and condition blocks.
  std::vector<Instruction*> inductions_0{}, inductions_1{};
  loop_0_->GetInductionVariables(inductions_0);
  RemoveIfNotUsedContinueOrConditionBlock(&inductions_0, loop_0_);

  if (inductions_0.size() != 1) {
    return false;
  }

  induction_0_ = inductions_0.front();

  loop_1_->GetInductionVariables(inductions_1);
  RemoveIfNotUsedContinueOrConditionBlock(&inductions_1, loop_1_);

  if (inductions_1.size() != 1) {
    return false;
  }

  induction_1_ = inductions_1.front();

  if (!CheckInit()) {
    return false;
  }

  if (!CheckCondition()) {
    return false;
  }

  if (!CheckStep()) {
    return false;
  }

  // Check adjacency, |loop_0_| should come just before |loop_1_|.
  // There is always at least one block between loops, even if it's empty.
  // We'll check at most 2 preceding blocks.

  auto pre_header_1 = loop_1_->GetPreHeaderBlock();

  std::vector<BasicBlock*> block_to_check{};
  block_to_check.push_back(pre_header_1);

  if (loop_0_->GetMergeBlock() != loop_1_->GetPreHeaderBlock()) {
    // Follow CFG for one more block.
    auto preds = context_->cfg()->preds(pre_header_1->id());
    if (preds.size() == 1) {
      auto block = &*containing_function_->FindBlock(preds.front());
      if (block == loop_0_->GetMergeBlock()) {
        block_to_check.push_back(block);
      } else {
        return false;
      }
    } else {
      return false;
    }
  }

  // Check that the separating blocks are either empty or only contains a store
  // to a local variable that is never read (left behind by
  // '--eliminate-local-multi-store'). Also allow OpPhi, since the loop could be
  // in LCSSA form.
  for (auto block : block_to_check) {
    for (auto& inst : *block) {
      if (inst.opcode() == spv::Op::OpStore) {
        // Get the definition of the target to check it's function scope so
        // there are no observable side effects.
        auto variable =
            context_->get_def_use_mgr()->GetDef(inst.GetSingleWordInOperand(0));

        if (variable->opcode() != spv::Op::OpVariable ||
            spv::StorageClass(variable->GetSingleWordInOperand(0)) !=
                spv::StorageClass::Function) {
          return false;
        }

        // Check the target is never loaded.
        auto is_used = false;
        context_->get_def_use_mgr()->ForEachUse(
            inst.GetSingleWordInOperand(0),
            [&is_used](Instruction* use_inst, uint32_t) {
              if (use_inst->opcode() == spv::Op::OpLoad) {
                is_used = true;
              }
            });

        if (is_used) {
          return false;
        }
      } else if (inst.opcode() == spv::Op::OpPhi) {
        if (inst.NumInOperands() != 2) {
          return false;
        }
      } else if (inst.opcode() != spv::Op::OpBranch) {
        return false;
      }
    }
  }

  return true;
}